

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall
mocker::ir::Interpreter::executePhis
          (Interpreter *this,
          vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
          *phis)

{
  element_type *peVar1;
  pointer __last;
  ulong uVar2;
  ulong uVar3;
  pointer __result;
  pointer pCVar4;
  long lVar5;
  long *__args_1;
  _Tp_alloc_type *__alloc;
  _Elt_pointer pAVar6;
  vector<Change,_std::allocator<Change>_> *__range2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  pointer reg;
  ulong uVar8;
  shared_ptr<mocker::ir::Reg> *__p;
  Change *change;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  pointer pCVar10;
  vector<Change,_std::allocator<Change>_> changes;
  shared_ptr<mocker::ir::Reg> local_58;
  Interpreter *local_48;
  pointer local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  changes.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  changes.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  changes.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pAVar6 = (this->ars).c.
           super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pAVar6 == (this->ars).c.
                super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pAVar6 = (this->ars).c.
             super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
  }
  p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (phis->
           super__Vector_base<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (phis->
                super__Vector_base<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  local_58.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  local_48 = this;
  do {
    __last = changes.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar10 = changes.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (p_Var9 == _Var7._M_pi) {
      for (; pCVar10 != __last; pCVar10 = pCVar10 + 1) {
        writeReg<long>(this,&pCVar10->reg,pCVar10->val);
      }
      std::vector<Change,_std::allocator<Change>_>::~vector(&changes);
      return;
    }
    peVar1 = ((__shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2> *)
             &p_Var9->_vptr__Sp_counted_base)->_M_ptr;
    reg = (peVar1->options).
          super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (reg == (peVar1->options).
                 super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("found",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                      ,0x1bb,
                      "void mocker::ir::Interpreter::executePhis(const std::vector<std::shared_ptr<Phi>> &)"
                     );
      }
      __args_1 = (long *)((reg->second).
                          super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->id;
      if (__args_1 == (long *)pAVar6[-1].lastBB) break;
      reg = reg + 1;
    }
    local_58.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)readVal(this,&reg->first);
    __p = &(((__shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2> *)
            &p_Var9->_vptr__Sp_counted_base)->_M_ptr->super_Definition).dest;
    if (__last == changes.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      if ((long)__last -
          (long)changes.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar2 = ((long)__last -
              (long)changes.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x18;
      local_40 = changes.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                 super__Vector_impl_data._M_start;
      uVar3 = uVar2;
      if (__last == changes.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                    super__Vector_impl_data._M_start) {
        uVar3 = 1;
      }
      uVar8 = uVar3 + uVar2;
      __alloc = (_Tp_alloc_type *)0x555555555555555;
      if (0x555555555555554 < uVar8) {
        uVar8 = 0x555555555555555;
      }
      if (CARRY8(uVar3,uVar2)) {
        uVar8 = 0x555555555555555;
      }
      local_38 = p_Var9;
      if (uVar8 == 0) {
        __result = (pointer)0x0;
      }
      else {
        __result = (pointer)operator_new(uVar8 * 0x18);
      }
      std::
      allocator_traits<std::allocator<mocker::ir::Interpreter::executePhis(std::vector<std::shared_ptr<mocker::ir::Phi>,std::allocator<std::shared_ptr<mocker::ir::Phi>>>const&)::Change>>
      ::
      construct<mocker::ir::Interpreter::executePhis(std::vector<std::shared_ptr<mocker::ir::Phi>,std::allocator<std::shared_ptr<mocker::ir::Phi>>>const&)::Change,std::shared_ptr<mocker::ir::Reg>const&,long>
                ((allocator_type *)(__result + uVar2),(Change *)__p,&local_58,(long *)__alloc);
      pCVar10 = local_40;
      pCVar4 = std::vector<Change,_std::allocator<Change>_>::_S_relocate
                         (local_40,__last,__result,__alloc);
      pCVar4 = std::vector<Change,_std::allocator<Change>_>::_S_relocate
                         (__last,__last,pCVar4 + 1,__alloc);
      lVar5 = (long)changes.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage - (long)pCVar10;
      std::_Vector_base<Change,_std::allocator<Change>_>::_M_deallocate
                ((_Vector_base<Change,_std::allocator<Change>_> *)pCVar10,(pointer)(lVar5 / 0x18),
                 lVar5 % 0x18);
      changes.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = __result + uVar8;
      _Var7._M_pi = local_58.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      this = local_48;
      p_Var9 = local_38;
      changes.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.super__Vector_impl_data.
      _M_start = __result;
    }
    else {
      std::
      allocator_traits<std::allocator<mocker::ir::Interpreter::executePhis(std::vector<std::shared_ptr<mocker::ir::Phi>,std::allocator<std::shared_ptr<mocker::ir::Phi>>>const&)::Change>>
      ::
      construct<mocker::ir::Interpreter::executePhis(std::vector<std::shared_ptr<mocker::ir::Phi>,std::allocator<std::shared_ptr<mocker::ir::Phi>>>const&)::Change,std::shared_ptr<mocker::ir::Reg>const&,long>
                ((allocator_type *)__last,(Change *)__p,&local_58,__args_1);
      pCVar4 = __last + 1;
    }
    p_Var9 = p_Var9 + 1;
    changes.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.super__Vector_impl_data.
    _M_finish = pCVar4;
  } while( true );
}

Assistant:

void Interpreter::executePhis(const std::vector<std::shared_ptr<Phi>> &phis) {
  struct Change {
    Change(std::shared_ptr<Addr> reg, int64_t val)
        : reg(std::move(reg)), val(val) {}
    std::shared_ptr<Addr> reg;
    std::int64_t val;
  };
  std::vector<Change> changes;
  auto &ar = ars.top();

  for (const auto &p : phis) {
    bool found = false;
    for (auto &option : p->getOptions()) {
      if (option.second->getID() == ar.lastBB) {
        auto val = readVal(option.first);
        changes.emplace_back(p->getDest(), (std::int64_t)val);
        found = true;
        break;
      }
    }
    assert(found);
  }

  for (const auto &change : changes) {
    writeReg(change.reg, change.val);
  }
}